

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.h
# Opt level: O0

path * fs::u8path(string *utf8_str)

{
  const_iterator __end;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RSI;
  path *in_RDI;
  long in_FS_OFFSET;
  path *in_stack_ffffffffffffff58;
  allocator<char8_t> *__a;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
  *in_stack_ffffffffffffff78;
  path *this;
  allocator<char8_t> local_51 [73];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  __end = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                    (&in_stack_ffffffffffffff58->_M_pathname);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
            (&in_RDI->_M_pathname);
  __a = local_51;
  std::allocator<char8_t>::allocator((allocator<char8_t> *)in_stack_ffffffffffffff58);
  std::__cxx11::u8string::
  u8string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            (in_stack_ffffffffffffff78,in_RSI,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__end._M_current,__a);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            (this,(basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
                  in_RSI._M_current,(format)((ulong)__end._M_current >> 0x38));
  path::path((path *)in_stack_ffffffffffffff58,(path *)0x4fa4fc);
  std::filesystem::__cxx11::path::~path(in_stack_ffffffffffffff58);
  std::__cxx11::u8string::~u8string
            ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
             in_stack_ffffffffffffff58);
  std::allocator<char8_t>::~allocator((allocator<char8_t> *)in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (path *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static inline path u8path(const std::string& utf8_str)
{
    return std::filesystem::path(std::u8string{utf8_str.begin(), utf8_str.end()});
}